

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

void slang::ast::CheckerInstanceSymbol::fromSyntax
               (CheckerSymbol *checker,HierarchyInstantiationSyntax *syntax,ASTContext *context,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets,
               bitmask<slang::ast::InstanceFlags> flags)

{
  Scope *this;
  CheckerSymbol *checker_00;
  SourceLocation SVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attributes;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attributes_00;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar2;
  ulong uVar3;
  long lVar4;
  SourceRange SVar5;
  Symbol *symbol;
  SmallVector<unsigned_int,_10UL> path;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  implicitNetNames;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe70;
  uint in_stack_fffffffffffffe74;
  bitmask<slang::ast::InstanceFlags> in_stack_fffffffffffffe80;
  CheckerInstanceSymbol *local_178;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_170;
  Compilation *local_168;
  Compilation *local_160;
  NetType *local_158;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_150;
  VariableDimensionSyntax **local_148;
  size_t sStack_140;
  undefined1 *local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined1 local_120 [40];
  undefined1 local_f8 [144];
  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  local_68;
  undefined8 local_48;
  undefined8 local_40;
  
  local_170 = results;
  local_160 = (Compilation *)checker;
  local_150 = implicitNets;
  if (syntax->parameters != (ParameterValueAssignmentSyntax *)0x0) {
    SVar5 = slang::syntax::SyntaxNode::sourceRange(&syntax->parameters->super_SyntaxNode);
    ASTContext::addDiag(context,(DiagCode)0x160006,SVar5);
  }
  local_f8._128_8_ = local_f8;
  local_68.groups_size_index = 0x3f;
  local_68.groups_size_mask = 1;
  local_68.elements_ = (value_type_pointer)0x0;
  local_68.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_48 = 0;
  local_40 = 0;
  local_138 = local_120;
  local_130 = 0;
  local_128 = 10;
  this = (context->scope).ptr;
  local_168 = this->compilation;
  local_f8._136_8_ = local_f8._128_8_;
  local_158 = Scope::getDefaultNetType(this);
  uVar3 = (syntax->instances).elements._M_extent._M_extent_value + 1;
  if (1 < uVar3) {
    uVar3 = uVar3 >> 1;
    lVar4 = 0;
    do {
      ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->instances).elements._M_ptr)->super_ConstTokenOrSyntax)
                                   .
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar4));
      checker_00 = (CheckerSymbol *)*ppSVar2;
      local_130 = 0;
      anon_unknown.dwarf_150eae5::createImplicitNets
                ((HierarchicalInstanceSyntax *)checker_00,context,local_158,flags,
                 (SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                  *)local_f8,local_150);
      SVar1 = (checker_00->super_Symbol).location;
      if (SVar1 == (SourceLocation)0x0) {
        SVar5 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)checker_00);
        ASTContext::addDiag(context,(DiagCode)0x4e0006,SVar5);
        attributes._M_extent._M_extent_value._0_4_ = 0;
        attributes._M_ptr = (pointer)&local_138;
        attributes._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffe64;
        local_178 = fromSyntax((CheckerInstanceSymbol *)local_168,(Compilation *)context,
                               (ASTContext *)local_160,checker_00,
                               (HierarchicalInstanceSyntax *)
                               (syntax->super_MemberSyntax).attributes.
                               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                               ._M_ptr,attributes,
                               (SmallVectorBase<unsigned_int> *)
                               (syntax->super_MemberSyntax).attributes.
                               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                               ._M_extent._M_extent_value,(bool)flags.m_bits,
                               (bitmask<slang::ast::InstanceFlags>)
                               (underlying_type)in_stack_fffffffffffffe70);
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)local_170,(Symbol **)&local_178);
      }
      else {
        local_148 = (VariableDimensionSyntax **)
                    (syntax->super_MemberSyntax).attributes.
                    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                    _M_ptr;
        sStack_140 = (syntax->super_MemberSyntax).attributes.
                     super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                     _M_extent._M_extent_value;
        in_stack_fffffffffffffe64 = (undefined4)(sStack_140 >> 0x20);
        in_stack_fffffffffffffe70 = 0;
        attributes_00._M_extent._M_extent_value._0_4_ = (int)&local_138;
        attributes_00._M_ptr = (pointer)sStack_140;
        attributes_00._M_extent._M_extent_value._4_4_ = (int)((ulong)&local_138 >> 0x20);
        local_178 = (CheckerInstanceSymbol *)
                    anon_unknown_287::recurseCheckerArray
                              ((anon_unknown_287 *)local_168,local_160,checker_00,
                               (HierarchicalInstanceSyntax *)context,
                               *(ASTContext **)((long)SVar1 + 0x50),
                               (DimIterator)
                               (&(*(ASTContext **)((long)SVar1 + 0x50))->scope +
                               *(long *)((long)SVar1 + 0x58)),(DimIterator)local_148,attributes_00,
                               (SmallVectorBase<unsigned_int> *)
                               ((ulong)in_stack_fffffffffffffe74 << 0x20),(bool)flags.m_bits,
                               in_stack_fffffffffffffe80);
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*const&>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)local_170,(Symbol **)&local_178);
      }
      lVar4 = lVar4 + 0x30;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  if (local_138 != local_120) {
    operator_delete(local_138);
  }
  boost::unordered::detail::foa::
  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::delete_((allocator_type)local_f8._136_8_,&local_68);
  return;
}

Assistant:

void CheckerInstanceSymbol::fromSyntax(const CheckerSymbol& checker,
                                       const HierarchyInstantiationSyntax& syntax,
                                       const ASTContext& context,
                                       SmallVectorBase<const Symbol*>& results,
                                       SmallVectorBase<const Symbol*>& implicitNets,
                                       bitmask<InstanceFlags> flags) {
    createCheckers(checker, syntax, context, results, implicitNets,
                   /* isProcedural */ false, flags);
}